

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O1

void __thiscall
wigwag::detail::
listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
::handler_node::~handler_node(handler_node *this)

{
  listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::handler_node::~handler_node((handler_node *)(this + -8));
  return;
}

Assistant:

virtual void release_token_impl()
            {
                life_assurance::release_life_assurance(*_listenable_impl);

                if (!suppress_populator() && _listenable_impl->get_handler_processor().has_withdraw_state())
                {
                    _listenable_impl->get_lock_primitive().lock_nonrecursive();
                    auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                    _listenable_impl->get_handler_processor().withdraw_state(_handler.ref());
                }

                _handler.ref().~handler_type();

                if (life_assurance::release_node())
                {
                    {
                        _listenable_impl->get_lock_primitive().lock_nonrecursive();
                        auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                        _listenable_impl->get_handlers_container().erase(*this);
                    }
                    delete this;
                }
            }